

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkTransferNames(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  
  if ((0 < (pNew->vCopies).nSize) || ((p->vCopies).nSize < 1)) {
    __assert_fail("!Wlc_NtkHasCopy(pNew) && Wlc_NtkHasCopy(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                  ,0x341,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
  }
  if (((pNew->vNameIds).nSize < 1) && (0 < (p->vNameIds).nSize)) {
    if ((pNew->pManName != (Abc_Nam_t *)0x0) || (p->pManName == (Abc_Nam_t *)0x0)) {
      __assert_fail("pNew->pManName == NULL && p->pManName != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                    ,0x343,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
    }
    uVar1 = pNew->nObjsAlloc;
    if ((pNew->vNameIds).nCap < (int)uVar1) {
      piVar5 = (pNew->vNameIds).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
      }
      (pNew->vNameIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNew->vNameIds).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((pNew->vNameIds).pArray,0,(ulong)uVar1 * 4);
    }
    (pNew->vNameIds).nSize = uVar1;
    iVar7 = p->nObjsAlloc;
    if (0 < iVar7) {
      lVar6 = 0;
      do {
        if ((p->vCopies).nSize <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = (p->vCopies).pArray[lVar6];
        if (((0 < (long)iVar2) && (lVar6 < (p->vNameIds).nSize)) &&
           (iVar3 = (p->vNameIds).pArray[lVar6], iVar3 != 0)) {
          if ((pNew->vNameIds).nSize <= iVar2) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pNew->vNameIds).pArray[iVar2] = iVar3;
          iVar7 = p->nObjsAlloc;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar7);
    }
    pNew->pManName = p->pManName;
    p->pManName = (Abc_Nam_t *)0x0;
    piVar5 = (p->vNameIds).pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      (p->vNameIds).pArray = (int *)0x0;
    }
    (p->vNameIds).nCap = 0;
    (p->vNameIds).nSize = 0;
    pVVar4 = p->vTables;
    pNew->pMemTable = p->pMemTable;
    pNew->vTables = pVVar4;
    p->pMemTable = (Mem_Flex_t *)0x0;
    p->vTables = (Vec_Ptr_t *)0x0;
    return;
  }
  __assert_fail("!Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                ,0x342,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
}

Assistant:

void Wlc_NtkTransferNames( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p )
{
    int i;
    assert( !Wlc_NtkHasCopy(pNew)   && Wlc_NtkHasCopy(p)   );
    assert( !Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p) );
    assert( pNew->pManName  == NULL && p->pManName != NULL );
    Wlc_NtkCleanNameId( pNew );
    for ( i = 0; i < p->nObjsAlloc; i++ )
        if ( Wlc_ObjCopy(p, i) > 0 && i < Vec_IntSize(&p->vNameIds) && Wlc_ObjNameId(p, i) )
            Wlc_ObjSetNameId( pNew, Wlc_ObjCopy(p, i), Wlc_ObjNameId(p, i) );
    pNew->pManName = p->pManName; 
    p->pManName = NULL;
    Vec_IntErase( &p->vNameIds );
    // transfer table
    pNew->pMemTable = p->pMemTable;  p->pMemTable = NULL;
    pNew->vTables = p->vTables;      p->vTables = NULL;
}